

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O3

string * __thiscall
duckdb::QueryProfiler::ToJSON_abi_cxx11_(string *__return_storage_ptr__,QueryProfiler *this)

{
  yyjson_val_pool *pyVar1;
  _Head_base<0UL,_duckdb::ProfilingNode_*,_false> _Var2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  yyjson_mut_doc *doc;
  pointer pPVar7;
  reference pvVar8;
  yyjson_mut_val *pyVar9;
  yyjson_mut_val *pyVar10;
  uint uVar11;
  yyjson_mut_val *object;
  char *pcVar12;
  yyjson_mut_val *pyVar13;
  yyjson_mut_doc *doc_00;
  _Head_base<0UL,_duckdb::ProfilingNode_*,_false> local_38;
  
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)&this->lock);
  if (iVar6 != 0) {
    ::std::__throw_system_error(iVar6);
  }
  doc = duckdb_yyjson::yyjson_mut_doc_new((yyjson_alc *)0x0);
  if (doc == (yyjson_mut_doc *)0x0) {
    doc_00 = (yyjson_mut_doc *)0x0;
  }
  else {
    pyVar1 = &doc->val_pool;
    doc_00 = (yyjson_mut_doc *)(doc->val_pool).cur;
    if ((yyjson_mut_doc *)(doc->val_pool).end == doc_00) {
      bVar5 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,1);
      if (bVar5) {
        doc_00 = (yyjson_mut_doc *)pyVar1->cur;
        goto LAB_01668cb3;
      }
LAB_01668fab:
      doc_00 = (yyjson_mut_doc *)0x0;
    }
    else {
LAB_01668cb3:
      pyVar1->cur = (yyjson_mut_val *)((yyjson_val_uni *)&doc_00->alc + 2);
      if (doc_00 == (yyjson_mut_doc *)0x0) goto LAB_01668fab;
      doc_00->root = (yyjson_mut_val *)0x7;
    }
    doc->root = (yyjson_mut_val *)doc_00;
  }
  _Var2._M_head_impl =
       (this->root).
       super_unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>_>._M_t.
       super___uniq_ptr_impl<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::ProfilingNode_*,_std::default_delete<duckdb::ProfilingNode>_>.
       super__Head_base<0UL,_duckdb::ProfilingNode_*,_false>._M_head_impl;
  object = (yyjson_mut_val *)
           ((this->query_info).query_name._M_string_length | (ulong)_Var2._M_head_impl);
  if (object == (yyjson_mut_val *)0x0) {
    if (((doc != (yyjson_mut_doc *)0x0) && (doc_00 != (yyjson_mut_doc *)0x0)) &&
       ((~*(uint *)&doc_00->root & 7) == 0)) {
      pyVar1 = &doc->val_pool;
      pyVar10 = (doc->val_pool).cur;
      object = (yyjson_mut_val *)((long)(doc->val_pool).end - (long)pyVar10 >> 3);
      if ((ulong)((long)object * -0x5555555555555555) < 2) {
        bVar5 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,2);
        if (!bVar5) goto LAB_01668f5e;
        pyVar10 = pyVar1->cur;
      }
      object = pyVar10 + 2;
      pyVar1->cur = object;
      if (pyVar10 != (yyjson_mut_val *)0x0) {
        pyVar9 = doc_00->root;
        pyVar10->tag = 0x60d;
        (pyVar10->uni).str = "result";
        pyVar10[1].tag = 0x50d;
        pcVar12 = "empty";
LAB_01668f1e:
        object = (yyjson_mut_val *)((ulong)pyVar9 & 0xffffffffffffff00);
        pyVar10[1].uni.str = pcVar12;
        pyVar13 = pyVar10;
        if ((yyjson_mut_val *)0xff < pyVar9) {
          lVar3 = *(long *)((doc_00->alc).malloc + 0x10);
          pyVar13 = *(yyjson_mut_val **)(lVar3 + 0x10);
          *(yyjson_mut_val **)(lVar3 + 0x10) = pyVar10;
        }
        pyVar10[1].next = pyVar13;
        pyVar10->next = pyVar10 + 1;
        (doc_00->alc).malloc = (_func_void_ptr_void_ptr_size_t *)pyVar10;
        doc_00->root = (yyjson_mut_val *)((long)&object[10].next + (ulong)*(byte *)&doc_00->root);
      }
    }
  }
  else {
    if (_Var2._M_head_impl != (ProfilingNode *)0x0) {
      pPVar7 = unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>::
               operator->(&this->root);
      ProfilingInfo::WriteMetricsToJSON(&pPVar7->profiling_info,doc,(yyjson_mut_val *)doc_00);
      bVar5 = true;
      if (doc == (yyjson_mut_doc *)0x0) {
LAB_01668ff0:
        pyVar10 = (yyjson_mut_val *)0x0;
      }
      else {
        pyVar1 = &doc->val_pool;
        pyVar10 = (doc->val_pool).cur;
        if ((doc->val_pool).end == pyVar10) {
          bVar4 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,1);
          if (!bVar4) goto LAB_01668ff0;
          pyVar10 = pyVar1->cur;
        }
        pyVar1->cur = pyVar10 + 1;
        if (pyVar10 == (yyjson_mut_val *)0x0) goto LAB_01668ff0;
        pyVar10->tag = 6;
        if ((doc_00 != (yyjson_mut_doc *)0x0) && ((~*(uint *)&doc_00->root & 7) == 0)) {
          object = (yyjson_mut_val *)
                   (((long)(doc->val_pool).end - (long)(pyVar10 + 1) >> 3) * -0x5555555555555555);
          if (object < (yyjson_mut_val *)0x2) {
            bVar5 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,2);
            if ((!bVar5) ||
               (pyVar9 = pyVar1->cur, pyVar1->cur = pyVar9 + 2, pyVar9 == (yyjson_mut_val *)0x0))
            goto LAB_01668d8a;
          }
          else {
            pyVar1->cur = pyVar10 + 3;
          }
          ToJSON_abi_cxx11_();
        }
LAB_01668d8a:
        bVar5 = false;
      }
      pPVar7 = unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>::
               operator->(&this->root);
      pvVar8 = vector<duckdb::unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>,_true>
               ::operator[](&pPVar7->children,0);
      local_38._M_head_impl =
           (pvVar8->
           super_unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>_>).
           _M_t.
           super___uniq_ptr_impl<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ProfilingNode_*,_std::default_delete<duckdb::ProfilingNode>_>
           .super__Head_base<0UL,_duckdb::ProfilingNode_*,_false>._M_head_impl;
      optional_ptr<duckdb::ProfilingNode,_true>::CheckValid
                ((optional_ptr<duckdb::ProfilingNode,_true> *)&local_38);
      pyVar9 = ToJSONRecursive(doc,local_38._M_head_impl);
      if (((!bVar5) && (pyVar9 != (yyjson_mut_val *)0x0)) &&
         (uVar11 = (uint)pyVar10->tag & 7, object = (yyjson_mut_val *)(ulong)uVar11, uVar11 == 6)) {
        ToJSON_abi_cxx11_();
      }
      StringifyAndFree_abi_cxx11_(__return_storage_ptr__,(duckdb *)doc,doc_00,object);
      goto LAB_01668f6c;
    }
    if (((doc != (yyjson_mut_doc *)0x0) && (doc_00 != (yyjson_mut_doc *)0x0)) &&
       ((~*(uint *)&doc_00->root & 7) == 0)) {
      pyVar1 = &doc->val_pool;
      pyVar10 = (doc->val_pool).cur;
      object = (yyjson_mut_val *)((long)(doc->val_pool).end - (long)pyVar10 >> 3);
      if ((ulong)((long)object * -0x5555555555555555) < 2) {
        bVar5 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,2);
        if (!bVar5) goto LAB_01668f5e;
        pyVar10 = pyVar1->cur;
      }
      object = pyVar10 + 2;
      pyVar1->cur = object;
      if (pyVar10 != (yyjson_mut_val *)0x0) {
        pyVar9 = doc_00->root;
        pyVar10->tag = 0x60d;
        (pyVar10->uni).str = "result";
        pyVar10[1].tag = 0x50d;
        pcVar12 = "error";
        goto LAB_01668f1e;
      }
    }
  }
LAB_01668f5e:
  StringifyAndFree_abi_cxx11_(__return_storage_ptr__,(duckdb *)doc,doc_00,object);
LAB_01668f6c:
  pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
  return __return_storage_ptr__;
}

Assistant:

string QueryProfiler::ToJSON() const {
	lock_guard<std::mutex> guard(lock);
	auto doc = yyjson_mut_doc_new(nullptr);
	auto result_obj = yyjson_mut_obj(doc);
	yyjson_mut_doc_set_root(doc, result_obj);

	if (query_info.query_name.empty() && !root) {
		yyjson_mut_obj_add_str(doc, result_obj, "result", "empty");
		return StringifyAndFree(doc, result_obj);
	}
	if (!root) {
		yyjson_mut_obj_add_str(doc, result_obj, "result", "error");
		return StringifyAndFree(doc, result_obj);
	}

	auto &settings = root->GetProfilingInfo();

	settings.WriteMetricsToJSON(doc, result_obj);

	// recursively print the physical operator tree
	auto children_list = yyjson_mut_arr(doc);
	yyjson_mut_obj_add_val(doc, result_obj, "children", children_list);
	auto child = ToJSONRecursive(doc, *root->GetChild(0));
	yyjson_mut_arr_add_val(children_list, child);
	return StringifyAndFree(doc, result_obj);
}